

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall
tcu::LogImage::LogImage
          (LogImage *this,string *name,string *description,Surface *surface,
          qpImageCompressionMode compression)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  Surface::getAccess(&this->m_access,surface);
  (this->m_scale).m_data[0] = 1.0;
  (this->m_scale).m_data[1] = 1.0;
  (this->m_scale).m_data[2] = 1.0;
  (this->m_scale).m_data[3] = 1.0;
  (this->m_bias).m_data[0] = 0.0;
  (this->m_bias).m_data[1] = 0.0;
  (this->m_bias).m_data[2] = 0.0;
  (this->m_bias).m_data[3] = 0.0;
  this->m_compression = compression;
  return;
}

Assistant:

LogImage::LogImage (const std::string& name, const std::string& description, const Surface& surface, qpImageCompressionMode compression)
	: m_name		(name)
	, m_description	(description)
	, m_access		(surface.getAccess())
	, m_scale		(1.0f, 1.0f, 1.0f, 1.0f)
	, m_bias		(0.0f, 0.0f, 0.0f, 0.0f)
	, m_compression	(compression)
{
}